

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void temp_sync(TCGContext_conflict9 *s,TCGTemp *ts,TCGRegSet allocated_regs,TCGRegSet preferred_regs
              ,int free_or_dead)

{
  byte bVar1;
  undefined8 uVar2;
  int *piVar3;
  byte *pbVar4;
  tcg_insn_unit *ptVar5;
  uint rm;
  int iVar6;
  uint r;
  int opc;
  TCGTemp *pTVar7;
  TCGContext_conflict9 *s_00;
  uint uVar8;
  undefined4 in_register_00000084;
  intptr_t iVar9;
  ulong uVar10;
  int in_R9D;
  
  iVar9 = CONCAT44(in_register_00000084,free_or_dead);
  uVar10 = *(ulong *)ts;
  if ((uVar10 >> 0x20 & 1) != 0) {
    return;
  }
  if ((uVar10 >> 0x23 & 1) != 0) goto LAB_00d0fccf;
  pTVar7 = ts;
  s_00 = s;
  if ((uVar10 >> 0x24 & 1) == 0) {
    temp_allocate_frame(s,ts);
  }
  uVar8 = (uint)pTVar7;
  uVar2 = *(undefined8 *)ts;
  if ((char)((ulong)uVar2 >> 8) == '\x01') {
LAB_00d0fca5:
    tcg_out_st(s,*(TCGReg *)ts >> 0x18,*(TCGReg *)ts & 0xff,(uint)*(byte *)ts->mem_base,
               ts->mem_offset);
  }
  else {
    rm = (uint)((ulong)uVar2 >> 8) & 0xff;
    if (rm != 2) {
      if (rm != 3) {
        temp_sync_cold_1();
        if (4 < uVar8) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                     ,0x459,(char *)0x0);
        }
        switch(uVar8) {
        case 0:
          uVar10 = 0;
          if (0 < (int)rm) {
            uVar10 = (ulong)rm;
          }
          uVar8 = (uint)uVar10;
          if (r < 0x10) {
            uVar8 = (uint)(uVar10 >> 3) & 1 | r >> 1 & 4;
            if (uVar8 != 0) {
              pbVar4 = s_00->code_ptr;
              s_00->code_ptr = pbVar4 + 1;
              *pbVar4 = (byte)uVar8 | 0x40;
            }
LAB_00d0fe05:
            ptVar5 = s_00->code_ptr;
            s_00->code_ptr = ptVar5 + 1;
            *ptVar5 = 0x8b;
            goto LAB_00d0fe54;
          }
          iVar6 = 0x56e;
          break;
        case 1:
          if (r < 0x10) {
            uVar8 = 0;
            if (0 < (int)rm) {
              uVar8 = rm;
            }
            pbVar4 = s_00->code_ptr;
            s_00->code_ptr = pbVar4 + 1;
            *pbVar4 = (byte)(uVar8 >> 3) & 1 | (byte)(r >> 1) & 4 | 0x48;
            goto LAB_00d0fe05;
          }
        case 2:
          uVar8 = 0;
          if (0 < (int)rm) {
            uVar8 = rm;
          }
          iVar6 = 0x2017e;
          break;
        case 3:
          uVar8 = 0;
          if (0 < (int)rm) {
            uVar8 = rm;
          }
          iVar6 = 0x56f;
          break;
        case 4:
          uVar8 = 0;
          if (0 < (int)rm) {
            uVar8 = rm;
          }
          iVar6 = 0xa016f;
        }
        tcg_out_vex_opc(s_00,iVar6,r,0,uVar8,in_R9D);
LAB_00d0fe54:
        tcg_out_sib_offset(s_00,r,rm,-1,0,iVar9);
        return;
      }
      if (free_or_dead == 0) {
LAB_00d0fc87:
        temp_load(s,ts,s->tcg_target_available_regs[(byte)ts->field_0x3],allocated_regs,
                  preferred_regs);
        goto LAB_00d0fca5;
      }
      bVar1 = *(byte *)ts->mem_base;
      iVar9 = ts->mem_offset;
      iVar6 = (int)ts->val;
      if ((char)((ulong)uVar2 >> 0x18) == '\0') {
        opc = 199;
      }
      else if ((((uint)((ulong)uVar2 >> 0x18) & 0xff) != 1) ||
              (opc = 0x10c7, (long)iVar6 != ts->val)) goto LAB_00d0fc87;
      tcg_out_opc(s,opc,0,(uint)bVar1,0);
      tcg_out_sib_offset(s,0,(uint)bVar1,-1,0,iVar9);
      piVar3 = (int *)s->code_ptr;
      *piVar3 = iVar6;
      s->code_ptr = (tcg_insn_unit *)(piVar3 + 1);
    }
  }
  *(ulong *)ts = *(ulong *)ts | 0x800000000;
LAB_00d0fccf:
  if (free_or_dead == 0) {
    return;
  }
  temp_free_or_dead(s,ts,free_or_dead);
  return;
}

Assistant:

static void temp_sync(TCGContext *s, TCGTemp *ts, TCGRegSet allocated_regs,
                      TCGRegSet preferred_regs, int free_or_dead)
{
    if (ts->fixed_reg) {
        return;
    }
    if (!ts->mem_coherent) {
        if (!ts->mem_allocated) {
            temp_allocate_frame(s, ts);
        }
        switch (ts->val_type) {
        case TEMP_VAL_CONST:
            /* If we're going to free the temp immediately, then we won't
               require it later in a register, so attempt to store the
               constant to memory directly.  */
            if (free_or_dead
                && tcg_out_sti(s, ts->type, ts->val,
                               ts->mem_base->reg, ts->mem_offset)) {
                break;
            }
            temp_load(s, ts, s->tcg_target_available_regs[ts->type],
                      allocated_regs, preferred_regs);
            /* fallthrough */

        case TEMP_VAL_REG:
            tcg_out_st(s, ts->type, ts->reg,
                       ts->mem_base->reg, ts->mem_offset);
            break;

        case TEMP_VAL_MEM:
            break;

        case TEMP_VAL_DEAD:
        default:
            tcg_abort();
        }
        ts->mem_coherent = 1;
    }
    if (free_or_dead) {
        temp_free_or_dead(s, ts, free_or_dead);
    }
}